

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderToolsCommon.cpp
# Opt level: O0

String * __thiscall
Diligent::ParserErrorMessage_abi_cxx11_
          (String *__return_storage_ptr__,Diligent *this,char *Message,Char *pBuffer,
          Char *pBufferEnd,char *pCurrPos)

{
  ostream *poVar1;
  string local_208;
  stringstream local_1d8 [8];
  stringstream Stream;
  ostream local_1c8 [376];
  ulong local_50;
  size_t LineOffset;
  Char *c;
  Char *pLineStart;
  size_t Line;
  char *pCurrPos_local;
  Char *pBufferEnd_local;
  Char *pBuffer_local;
  char *Message_local;
  
  pLineStart = (Char *)0x0;
  c = Message;
  for (LineOffset = (size_t)Message; LineOffset < pBufferEnd; LineOffset = LineOffset + 1) {
    if (*(char *)LineOffset == '\n') {
      pLineStart = pLineStart + 1;
      c = (Char *)LineOffset;
    }
  }
  local_50 = (long)pBufferEnd - (long)c;
  Line = (size_t)pBufferEnd;
  pCurrPos_local = pBuffer;
  pBufferEnd_local = Message;
  pBuffer_local = (Char *)this;
  Message_local = (char *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1d8);
  poVar1 = std::operator<<(local_1c8,"[");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(ulong)pLineStart);
  poVar1 = std::operator<<(poVar1,",");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_50);
  poVar1 = std::operator<<(poVar1,"]: ");
  poVar1 = std::operator<<(poVar1,pBuffer_local);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  Parsing::GetContext<char_const*>
            (&local_208,(Parsing *)&pBufferEnd_local,&pCurrPos_local,(char **)Line,(char *)0x1,
             (size_t)pCurrPos);
  std::operator<<(poVar1,(string *)&local_208);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1d8);
  return __return_storage_ptr__;
}

Assistant:

static String ParserErrorMessage(const char* Message, const Char* pBuffer, const Char* pBufferEnd, const char* pCurrPos)
{
    size_t      Line       = 0;
    const auto* pLineStart = pBuffer;
    for (const auto* c = pBuffer; c < pCurrPos; ++c)
    {
        if (*c == '\n')
        {
            ++Line;
            pLineStart = c;
        }
    }
    size_t LineOffset = pCurrPos - pLineStart;

    std::stringstream Stream;
    Stream << "[" << Line << "," << LineOffset << "]: " << Message << std::endl
           << GetContext(pBuffer, pBufferEnd, pCurrPos, 1);
    return Stream.str();
}